

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random-solver.cpp
# Opt level: O0

bool __thiscall
baryonyx::itm::
solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>>
::
compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>>
           *this,bit_array *x,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last,double kappa,
          double delta,double theta)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  __tuple_element_t<0UL,_tuple<col_value_*,_col_value_*>_> *ppcVar5;
  __tuple_element_t<1UL,_tuple<col_value_*,_col_value_*>_> *ppcVar6;
  type piVar7;
  type pdVar8;
  type prVar9;
  pointer begin;
  pointer prVar10;
  type pbVar11;
  type prVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  bool local_132;
  bool local_131;
  bool local_12a;
  bool local_129;
  type var_2;
  type var_1;
  type var;
  double two;
  double one;
  bool local_ad;
  int i;
  bool valid;
  int value;
  type *col_end;
  type *col_begin;
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_88;
  double sum_a_p;
  type it;
  __tuple_element_t<1UL,_tuple<row_value_*,_row_value_*>_> *pprStack_70;
  int r_size;
  type *row_end;
  type *row_begin;
  unique_ptr<int[],_std::default_delete<int[]>_> local_50;
  int local_44;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false> _Stack_40;
  int k;
  double theta_local;
  double delta_local;
  double kappa_local;
  bit_array *x_local;
  solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
  *this_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first_local;
  
  _Stack_40._M_head_impl = (row_value *)theta;
  theta_local = delta;
  delta_local = kappa;
  kappa_local = (double)x;
  x_local = (bit_array *)this;
  this_local = (solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
                *)last._M_current;
  last_local._M_current = first._M_current;
  while( true ) {
    bVar3 = __gnu_cxx::operator==<int_*,_std::vector<int,_std::allocator<int>_>_>
                      (&last_local,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       &this_local);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      return false;
    }
    local_50._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
    super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
    _M_head_impl = (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)
                   (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)
                   last_local._M_current;
    local_44 = constraint<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                         (last_local);
    if (*(int *)(this + 0x80) <= local_44) break;
    sparse_matrix<int>::row((sparse_matrix<int> *)&row_begin,(int)this + 8);
    row_end = std::
              get<0ul,baryonyx::sparse_matrix<int>::row_value*,baryonyx::sparse_matrix<int>::row_value*>
                        ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                          *)&row_begin);
    pprStack_70 = std::
                  get<1ul,baryonyx::sparse_matrix<int>::row_value*,baryonyx::sparse_matrix<int>::row_value*>
                            ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                              *)&row_begin);
    solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
    ::decrease_preference
              ((solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
                *)this,*row_end,*pprStack_70,(double)_Stack_40._M_head_impl);
    it._4_4_ = 0;
    for (sum_a_p = (double)*row_end;
        (__tuple_element_t<1UL,_tuple<row_value_*,_row_value_*>_>)sum_a_p != *pprStack_70;
        sum_a_p = (double)((long)sum_a_p + 8)) {
      local_88._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
      super__Head_base<0UL,_int_*,_false>._M_head_impl =
           (tuple<int_*,_std::default_delete<int[]>_>)
           (_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)0x0;
      sparse_matrix<int>::column((sparse_matrix<int> *)&col_begin,(int)this + 8);
      ppcVar5 = std::
                get<0ul,baryonyx::sparse_matrix<int>::col_value*,baryonyx::sparse_matrix<int>::col_value*>
                          ((tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
                            *)&col_begin);
      ppcVar6 = std::
                get<1ul,baryonyx::sparse_matrix<int>::col_value*,baryonyx::sparse_matrix<int>::col_value*>
                          ((tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
                            *)&col_begin);
      while (iVar1 = it._4_4_, *ppcVar5 != *ppcVar6) {
        piVar7 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                           ((unique_ptr<int[],_std::default_delete<int[]>_> *)(this + 0x48),
                            (long)(*ppcVar5)->value);
        iVar1 = *piVar7;
        pdVar8 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                           ((unique_ptr<double[],_std::default_delete<double[]>_> *)(this + 0x68),
                            (long)(*ppcVar5)->value);
        auVar20._8_8_ = 0;
        auVar20._0_8_ = (double)iVar1;
        auVar15._8_8_ = 0;
        auVar15._0_8_ = *pdVar8;
        auVar25._8_8_ = 0;
        auVar25._0_8_ =
             local_88._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
             super__Head_base<0UL,_int_*,_false>._M_head_impl;
        auVar15 = vfmadd213sd_fma(auVar15,auVar20,auVar25);
        local_88._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
        super__Head_base<0UL,_int_*,_false>._M_head_impl = auVar15._0_8_;
        *ppcVar5 = *ppcVar5 + 1;
      }
      prVar9 = std::
               unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
               ::operator[]((unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
                             *)(this + 0x50),(long)it._4_4_);
      prVar9->id = iVar1;
      piVar7 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                         ((unique_ptr<int[],_std::default_delete<int[]>_> *)(this + 0x48),
                          (long)*(int *)sum_a_p);
      iVar1 = *piVar7;
      prVar9 = std::
               unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
               ::operator[]((unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
                             *)(this + 0x50),(long)it._4_4_);
      prVar9->a = iVar1;
      dVar13 = quadratic_cost_type<double>::operator()
                         (*(quadratic_cost_type<double> **)(this + 0x70),(*row_end)->column,
                          (bit_array *)kappa_local);
      dVar13 = dVar13 - (double)local_88._M_t.
                                super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                                super__Head_base<0UL,_int_*,_false>._M_head_impl;
      prVar9 = std::
               unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
               ::operator[]((unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
                             *)(this + 0x50),(long)it._4_4_);
      prVar9->value = dVar13;
      it._4_4_ = it._4_4_ + 1;
    }
    begin = std::
            unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
            ::get((unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
                   *)(this + 0x50));
    prVar10 = std::
              unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
              ::get((unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
                     *)(this + 0x50));
    calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>>::rc_data*>
              (begin,prVar10 + it._4_4_,*(random_engine **)this);
    i = 0;
    pbVar11 = std::
              unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor[]>_>
              ::operator[]((unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor[]>_>
                            *)(this + 0x58),(long)local_44);
    one._4_4_ = -1;
    if (0 < pbVar11->min) {
      do {
        iVar4 = one._4_4_ + 1;
        prVar9 = std::
                 unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
                 ::operator[]((unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
                               *)(this + 0x50),(long)iVar4);
        i = prVar9->a + i;
        pbVar11 = std::
                  unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor[]>_>
                  ::operator[]((unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor[]>_>
                                *)(this + 0x58),(long)local_44);
        iVar1 = pbVar11->min;
        prVar12 = *row_end;
        prVar9 = std::
                 unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
                 ::operator[]((unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
                               *)(this + 0x50),(long)iVar4);
        iVar2 = prVar9->id;
        bit_array_impl::set((bit_array_impl *)kappa_local,prVar12[iVar2].column);
        dVar13 = theta_local;
        dVar14 = delta_local / (1.0 - delta_local);
        prVar9 = std::
                 unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
                 ::operator[]((unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
                               *)(this + 0x50),(long)iVar4);
        auVar26._8_8_ = 0;
        auVar26._0_8_ = dVar13;
        auVar21._8_8_ = 0;
        auVar21._0_8_ = dVar14;
        auVar16._0_8_ = prVar9->value / 2.0;
        auVar16._8_8_ = 0;
        auVar15 = vfmadd213sd_fma(auVar16,auVar21,auVar26);
        pdVar8 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                           ((unique_ptr<double[],_std::default_delete<double[]>_> *)(this + 0x68),
                            (long)prVar12[iVar2].value);
        *pdVar8 = auVar15._0_8_ + *pdVar8;
        local_129 = i < iVar1 && one._4_4_ + 2 < it._4_4_;
        one._4_4_ = iVar4;
      } while (local_129);
    }
    pbVar11 = std::
              unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor[]>_>
              ::operator[]((unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor[]>_>
                            *)(this + 0x58),(long)local_44);
    local_12a = false;
    if (pbVar11->min <= i) {
      pbVar11 = std::
                unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor[]>_>
                ::operator[]((unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor[]>_>
                              *)(this + 0x58),(long)local_44);
      local_12a = i <= pbVar11->max;
    }
    local_ad = local_12a;
    while( true ) {
      local_131 = false;
      if (one._4_4_ + 1 < it._4_4_) {
        local_131 = local_ad;
      }
      if (local_131 == false) break;
      one._4_4_ = one._4_4_ + 1;
      prVar9 = std::
               unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
               ::operator[]((unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
                             *)(this + 0x50),(long)one._4_4_);
      i = prVar9->a + i;
      pbVar11 = std::
                unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor[]>_>
                ::operator[]((unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor[]>_>
                              *)(this + 0x58),(long)local_44);
      local_132 = false;
      if (pbVar11->min <= i) {
        pbVar11 = std::
                  unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor[]>_>
                  ::operator[]((unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor[]>_>
                                *)(this + 0x58),(long)local_44);
        local_132 = i <= pbVar11->max;
      }
      local_ad = local_132;
      prVar12 = *row_end;
      prVar9 = std::
               unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
               ::operator[]((unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
                             *)(this + 0x50),(long)one._4_4_);
      prVar12 = prVar12 + prVar9->id;
      if (local_132 != false) {
        prVar9 = std::
                 unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
                 ::operator[]((unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
                               *)(this + 0x50),(long)one._4_4_);
        local_ad = stop_iterating<baryonyx::itm::maximize_tag,double>
                             (prVar9->value,*(random_engine **)this);
      }
      if (local_ad == false) {
        bit_array_impl::unset((bit_array_impl *)kappa_local,prVar12->column);
        dVar13 = theta_local;
        dVar14 = delta_local / (1.0 - delta_local);
        prVar9 = std::
                 unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
                 ::operator[]((unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
                               *)(this + 0x50),(long)one._4_4_);
        auVar28._8_8_ = 0;
        auVar28._0_8_ = dVar13;
        auVar23._8_8_ = 0;
        auVar23._0_8_ = dVar14;
        auVar18._0_8_ = prVar9->value / 2.0;
        auVar18._8_8_ = 0;
        auVar15 = vfmadd213sd_fma(auVar18,auVar23,auVar28);
        pdVar8 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                           ((unique_ptr<double[],_std::default_delete<double[]>_> *)(this + 0x68),
                            (long)prVar12->value);
        *pdVar8 = *pdVar8 - auVar15._0_8_;
      }
      else {
        bit_array_impl::set((bit_array_impl *)kappa_local,prVar12->column);
        dVar13 = theta_local;
        dVar14 = delta_local / (1.0 - delta_local);
        prVar9 = std::
                 unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
                 ::operator[]((unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
                               *)(this + 0x50),(long)one._4_4_);
        auVar27._8_8_ = 0;
        auVar27._0_8_ = dVar13;
        auVar22._8_8_ = 0;
        auVar22._0_8_ = dVar14;
        auVar17._0_8_ = prVar9->value / 2.0;
        auVar17._8_8_ = 0;
        auVar15 = vfmadd213sd_fma(auVar17,auVar22,auVar27);
        pdVar8 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                           ((unique_ptr<double[],_std::default_delete<double[]>_> *)(this + 0x68),
                            (long)prVar12->value);
        *pdVar8 = auVar15._0_8_ + *pdVar8;
      }
    }
    while (one._4_4_ + 1 < it._4_4_) {
      one._4_4_ = one._4_4_ + 1;
      prVar12 = *row_end;
      prVar9 = std::
               unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
               ::operator[]((unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
                             *)(this + 0x50),(long)one._4_4_);
      iVar1 = prVar9->id;
      bit_array_impl::unset((bit_array_impl *)kappa_local,prVar12[iVar1].column);
      dVar13 = theta_local;
      dVar14 = delta_local / (1.0 - delta_local);
      prVar9 = std::
               unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
               ::operator[]((unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
                             *)(this + 0x50),(long)one._4_4_);
      auVar29._8_8_ = 0;
      auVar29._0_8_ = dVar13;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = dVar14;
      auVar19._0_8_ = prVar9->value / 2.0;
      auVar19._8_8_ = 0;
      auVar15 = vfmadd213sd_fma(auVar19,auVar24,auVar29);
      pdVar8 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                         ((unique_ptr<double[],_std::default_delete<double[]>_> *)(this + 0x68),
                          (long)prVar12[iVar1].value);
      *pdVar8 = *pdVar8 - auVar15._0_8_;
    }
    bVar3 = is_valid_constraint<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>>,baryonyx::bit_array>
                      ((solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
                        *)this,local_44,(bit_array *)kappa_local);
    if (!bVar3) {
      details::fail_fast("Precondition","is_valid_constraint(*this, k, x)",
                         "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/random-solver.cpp"
                         ,"335");
    }
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&last_local);
  }
  details::fail_fast("Precondition","k < m",
                     "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/random-solver.cpp"
                     ,"186");
}

Assistant:

bool compute_update_row(Xtype& x,
                            Iterator first,
                            Iterator last,
                            Float kappa,
                            Float delta,
                            Float theta)
    {
        for (; first != last; ++first) {
            auto k = constraint(first);
            bx_expects(k < m);

            auto [row_begin, row_end] = ap.row(k);
            decrease_preference(row_begin, row_end, theta);

            int r_size = 0;
            for (auto it = row_begin; it != row_end; ++it, ++r_size) {
                Float sum_a_p = 0;

                auto [col_begin, col_end] = ap.column(it->column);
                for (; col_begin != col_end; ++col_begin)
                    sum_a_p += static_cast<Float>(A[col_begin->value]) *
                               P[col_begin->value];

                R[r_size].id = r_size;
                R[r_size].a = A[it->value];
                R[r_size].value = c(row_begin->column, x) - sum_a_p;
            }

            calculator_sort<Mode>(R.get(), R.get() + r_size, rng);

            int value = 0;
            bool valid = b[k].min <= 0;
            int i = -1;

            // if (!valid) {
            //     do {
            //         ++i;
            //         value += R[i].a;
            //         valid = b[k].min <= value;
            //     } while (!valid && i + 1 < r_size);
            // }

            // valid = b[k].min <= value && value <= b[k].max;
            // while (i + 1 < r_size && valid) {
            //     ++i;
            //     value += R[i].a;
            //     valid = b[k].min <= value && value <= b[k].max;
            // }

            // std::uniform_real_distribution<Float> real_dist(Float{ 0 },
            //                                                 Float{ 1 });

            // auto selected = i;
            // auto d = delta;

            // if (selected < 0) {
            //     d += (kappa / (one - kappa)) * (R[0].value / two);
            //     d *= real_dist(rng);

            //     for (i = 0; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         } else {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         }
            //     }
            // } else if (selected + 1 >= r_size) {
            //     d += (kappa / (one - kappa)) * (R[selected].value * middle);
            //     d *= real_dist(rng);

            //     for (i = 0; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         } else {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         }
            //     }
            // } else {
            //     d += (kappa / (one - kappa)) *
            //          (R[selected + 1].value - R[selected].value);
            //     d *= real_dist(rng);

            //     for (i = 0; i <= selected; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         } else {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         }
            //     }

            //     for (; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         } else {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         }
            //     }

            constexpr Float one{ 1 };
            constexpr Float two{ 2 };

            if (!valid) {
                do {
                    ++i;
                    value += R[i].a;
                    valid = b[k].min <= value;
                    auto var = row_begin + R[i].id;
                    x.set(var->column);
                    P[var->value] +=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                } while (!valid && i + 1 < r_size);
            }

            valid = b[k].min <= value && value <= b[k].max;
            while (i + 1 < r_size && valid) {
                ++i;
                value += R[i].a;
                valid = b[k].min <= value && value <= b[k].max;
                auto var = row_begin + R[i].id;

                if (valid)
                    valid = stop_iterating<Mode>(R[i].value, rng);

                if (valid) {
                    x.set(var->column);
                    P[var->value] +=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                } else {
                    x.unset(var->column);
                    P[var->value] -=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                }
            }

            while (i + 1 < r_size) {
                ++i;
                auto var = row_begin + R[i].id;
                x.unset(var->column);
                P[var->value] -=
                  delta + (kappa / (one - kappa)) * (R[i].value / two);
            }

            bx_expects(is_valid_constraint(*this, k, x));
        }

        return false;
    }